

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O1

bool __thiscall pg::NPPSolver::atronsubgameup(NPPSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar5;
  _List_node_base *p_Var6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  uint64_t *puVar9;
  uint *puVar10;
  uint64_t *puVar11;
  Game *pGVar12;
  bitset *pbVar13;
  bitset *pbVar14;
  bool bVar15;
  ulong uVar16;
  int to;
  ulong uVar17;
  int *piVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  _List_node_base *p_Var23;
  ulong uVar24;
  _List_node_base *p_Var25;
  int iVar26;
  uint *puVar27;
  _List_node_base *p_Var28;
  int to_1;
  bool bVar29;
  uint local_84;
  int *local_80;
  Game *local_78;
  long local_70;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_68;
  bitset *local_60;
  pointer local_58;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_50;
  pointer local_48;
  uint *local_40;
  uint *local_38;
  
  local_50 = (this->Entries).
             super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[this->Pivot];
  plVar5 = *(list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             **)&(local_50->
                 super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl._M_node;
  if (plVar5 != local_50) {
    local_58 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_60 = local_58[this->Top];
    do {
      local_68 = plVar5;
      p_Var23 = *(_List_node_base **)
                 ((long)&local_68[1].
                         super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl._M_node + 8);
      p_Var6 = *(_List_node_base **)
                ((long)&local_68[2].
                        super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl._M_node + 0x10);
      if (p_Var23 != p_Var6) {
        p_Var28 = *(_List_node_base **)
                   &local_68[2].
                    super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl._M_node;
        p_Var25 = *(_List_node_base **)
                   ((long)&local_68[2].
                           super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl._M_node + 8);
        puVar7 = local_60->_bits;
        puVar8 = (this->R)._bits;
        local_78 = (this->super_Solver).game;
        local_80 = this->strategy;
        puVar9 = (this->outgame)._bits;
        local_48 = (this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        puVar10 = (this->E).queue;
        local_40 = (this->T).queue;
        do {
          uVar2 = *(uint *)&p_Var23->_M_next;
          uVar21 = (ulong)(int)uVar2;
          this->pos = uVar2;
          uVar16 = uVar21 >> 6;
          if (((puVar7[uVar16] >> (uVar21 & 0x3f) & 1) == 0) &&
             (uVar17 = 1L << (uVar21 & 0x3f), (puVar8[uVar16] & uVar17) == 0)) {
            if (this->alpha == (uint)(((local_78->_owner)._bits[uVar16] & uVar17) != 0)) {
              iVar26 = local_78->_outedges[local_78->_firstouts[uVar21]];
              uVar16 = (ulong)iVar26;
              bVar29 = uVar16 != 0xffffffffffffffff;
              if (bVar29) {
                if ((puVar8[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
                  piVar18 = local_78->_outedges + (long)local_78->_firstouts[uVar21] + 1;
                  do {
                    iVar26 = *piVar18;
                    uVar16 = (ulong)iVar26;
                    bVar29 = uVar16 != 0xffffffffffffffff;
                    if (uVar16 == 0xffffffffffffffff) goto LAB_00150031;
                    piVar18 = piVar18 + 1;
                  } while ((puVar8[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0);
                }
                if (((puVar8[uVar2 >> 6] >> (uVar21 & 0x3f) & 1) != 0) && (local_80[uVar2] != -1)) {
                  iVar26 = local_80[uVar2];
                }
                goto LAB_00150012;
              }
            }
            else {
              uVar3 = local_78->_outedges[local_78->_firstouts[uVar21]];
              bVar29 = uVar3 == 0xffffffff;
              if (!bVar29) {
                pbVar13 = local_58[this->Top];
                local_38 = (this->E).queue;
                puVar27 = (uint *)(local_78->_outedges + (long)local_78->_firstouts[uVar21] + 1);
                do {
                  uVar16 = (ulong)(long)(int)uVar3 >> 6;
                  bVar15 = false;
                  if (((puVar9[uVar16] >> ((ulong)uVar3 & 0x3f) & 1) == 0) &&
                     (uVar21 = 1L << ((ulong)uVar3 & 0x3f), (puVar8[uVar16] & uVar21) == 0)) {
                    if ((pbVar13->_bits[uVar16] & uVar21) == 0) {
                      (this->E).pointer = 0;
                      bVar15 = true;
                    }
                    else {
                      iVar26 = (this->E).pointer;
                      (this->E).pointer = iVar26 + 1;
                      local_38[iVar26] = uVar3;
                      bVar15 = false;
                    }
                  }
                  if (bVar15) goto LAB_00150031;
                  uVar3 = *puVar27;
                  puVar27 = puVar27 + 1;
                  bVar29 = uVar3 == 0xffffffff;
                } while (!bVar29);
              }
              iVar26 = (this->E).pointer;
              lVar19 = (long)iVar26;
              if (lVar19 != 0) {
                puVar11 = local_48[this->Pivot]->_bits;
                do {
                  iVar26 = iVar26 + -1;
                  (this->E).pointer = iVar26;
                  uVar3 = puVar10[lVar19 + -1];
                  puVar11[uVar3 >> 6] = puVar11[uVar3 >> 6] | 1L << ((ulong)uVar3 & 0x3f);
                  lVar19 = lVar19 + -1;
                } while (lVar19 != 0);
              }
              iVar26 = -1;
LAB_00150012:
              local_80[uVar2] = iVar26;
            }
LAB_00150031:
            if (bVar29) {
              uVar4 = this->pos;
              puVar8[(ulong)(long)(int)uVar4 >> 6] =
                   puVar8[(ulong)(long)(int)uVar4 >> 6] | 1L << ((long)(int)uVar4 & 0x3fU);
              iVar26 = (this->T).pointer;
              (this->T).pointer = iVar26 + 1;
              local_40[iVar26] = uVar4;
            }
          }
          p_Var23 = (_List_node_base *)((long)&p_Var23->_M_next + 4);
          if (p_Var23 == p_Var28) {
            p_Var23 = p_Var25->_M_prev;
            p_Var25 = (_List_node_base *)&p_Var25->_M_prev;
            p_Var28 = p_Var23 + 0x20;
          }
        } while (p_Var23 != p_Var6);
      }
      plVar5 = *(list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 **)&(local_68->
                     super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl._M_node;
    } while (plVar5 != local_50);
  }
  iVar26 = (this->T).pointer;
  local_80 = (int *)CONCAT44(local_80._4_4_,iVar26);
  do {
    if (iVar26 == 0) {
      return (int)local_80 != 0;
    }
    iVar26 = (this->T).pointer;
    (this->T).pointer = iVar26 + -1;
    local_70 = (long)(int)(this->T).queue[(long)iVar26 + -1];
    pGVar12 = (this->super_Solver).game;
    piVar18 = pGVar12->_inedges;
    iVar26 = pGVar12->_firstins[local_70];
    local_84 = piVar18[iVar26];
    if (local_84 != 0xffffffff) {
      pbVar13 = (this->Supgame).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                _M_impl.super__Vector_impl_data._M_start[this->Top];
      lVar19 = *(long *)&((this->Entries).
                          super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[this->Pivot]->
                         super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         )._M_impl._M_node;
      piVar18 = piVar18 + iVar26;
      do {
        uVar16 = (ulong)local_84;
        uVar17 = (ulong)(int)local_84;
        puVar7 = (this->outgame)._bits;
        uVar21 = uVar17 >> 6;
        if ((puVar7[uVar21] >> (uVar16 & 0x3f) & 1) == 0) {
          uVar20 = 1L << (uVar16 & 0x3f);
          puVar8 = (this->R)._bits;
          if ((puVar8[uVar21] & uVar20) == 0) {
            if ((pbVar13->_bits[uVar21] & uVar20) == 0) {
              pGVar12 = (this->super_Solver).game;
              if (this->alpha == (uint)(((pGVar12->_owner)._bits[uVar21] & uVar20) != 0)) {
                puVar8[uVar21] = puVar8[uVar21] | uVar20;
                this->strategy[uVar17] = (int)local_70;
                iVar26 = (this->T).pointer;
                (this->T).pointer = iVar26 + 1;
                (this->T).queue[iVar26] = local_84;
              }
              else {
                uVar2 = pGVar12->_outedges[pGVar12->_firstouts[uVar17]];
                bVar29 = uVar2 == 0xffffffff;
                if (!bVar29) {
                  pbVar14 = (this->Supgame).
                            super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                            super__Vector_impl_data._M_start[this->Top];
                  local_78 = (Game *)(this->E).queue;
                  puVar27 = (uint *)(pGVar12->_outedges + (long)pGVar12->_firstouts[uVar17] + 1);
                  do {
                    uVar17 = (ulong)(long)(int)uVar2 >> 6;
                    bVar15 = false;
                    if (((puVar7[uVar17] >> ((ulong)uVar2 & 0x3f) & 1) == 0) &&
                       (uVar24 = 1L << ((ulong)uVar2 & 0x3f), (puVar8[uVar17] & uVar24) == 0)) {
                      if ((pbVar14->_bits[uVar17] & uVar24) == 0) {
                        (this->E).pointer = 0;
                        bVar15 = true;
                      }
                      else {
                        iVar26 = (this->E).pointer;
                        (this->E).pointer = iVar26 + 1;
                        *(uint *)((long)&local_78->n_vertices + (long)iVar26 * 4) = uVar2;
                        bVar15 = false;
                      }
                    }
                    if (bVar15) goto LAB_001502e6;
                    uVar2 = *puVar27;
                    puVar27 = puVar27 + 1;
                    bVar29 = uVar2 == 0xffffffff;
                  } while (!bVar29);
                }
                iVar26 = (this->E).pointer;
                lVar22 = (long)iVar26;
                if (lVar22 != 0) {
                  puVar10 = (this->E).queue;
                  puVar7 = (this->Exits).
                           super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
                           super__Vector_impl_data._M_start[this->Pivot]->_bits;
                  do {
                    iVar26 = iVar26 + -1;
                    (this->E).pointer = iVar26;
                    uVar2 = puVar10[lVar22 + -1];
                    puVar1 = puVar7 + (uVar2 >> 6);
                    *puVar1 = *puVar1 | 1L << ((ulong)uVar2 & 0x3f);
                    lVar22 = lVar22 + -1;
                  } while (lVar22 != 0);
                }
                this->strategy[uVar16] = -1;
LAB_001502e6:
                if (bVar29) {
                  puVar8[uVar21] = puVar8[uVar21] | uVar20;
                  iVar26 = (this->T).pointer;
                  (this->T).pointer = iVar26 + 1;
                  (this->T).queue[iVar26] = local_84;
                }
              }
            }
            else {
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar19 + 0x10),
                         &local_84);
            }
          }
        }
        local_84 = piVar18[1];
        piVar18 = piVar18 + 1;
      } while (local_84 != 0xffffffff);
    }
    iVar26 = (this->T).pointer;
  } while( true );
}

Assistant:

bool NPPSolver::atronsubgameup()
{
    auto & supgame = *(Supgame[Top]);
    auto & entries = *(Entries[Pivot]);
    auto lend = entries.end();
    for (auto liter = entries.begin(); liter != lend; ++liter)
    {
        auto & rdeque = *liter;
        auto dend = rdeque.end();
        for (auto diter = rdeque.begin(); diter != dend; ++diter)
        {
            pos = *diter;
            if (!supgame[pos] && !R[pos] && isclosedonsubgame(pos))
            {
                R[pos] = true;
                T.push(pos);
            }
        }
    }
    if (T.nonempty())
    {
        do
        {
            pushinqueueonsubgameup(T.pop());
        }
        while (T.nonempty());
        return (true);
    }
    else
    {
        return (false);
    }
}